

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O0

_Bool stk_MoveCardFromTo(SolStack_t *sourcePtr,SolStack_t *targetPtr)

{
  Card_t card_00;
  Card_t card_01;
  _Bool _Var1;
  undefined1 local_2c [8];
  Card_t card;
  SolStack_t *targetPtr_local;
  SolStack_t *sourcePtr_local;
  
  if (((sourcePtr == (SolStack_t *)0x0) || (targetPtr == (SolStack_t *)0x0)) ||
     (card._4_8_ = targetPtr, _Var1 = stk_Pop(sourcePtr,(Card_t *)local_2c), !_Var1)) {
    sourcePtr_local._7_1_ = false;
  }
  else {
    card_01.m_face = card.m_type;
    card_01.m_type = local_2c._0_4_;
    card_01.m_color = local_2c._4_4_;
    _Var1 = stk_PushCopy((SolStack_t *)card._4_8_,card_01);
    if (_Var1) {
      stk_TurnTopCardUp(sourcePtr);
      sourcePtr_local._7_1_ = true;
    }
    else {
      card_00.m_face = card.m_type;
      card_00.m_type = local_2c._0_4_;
      card_00.m_color = local_2c._4_4_;
      stk_PushCopy(sourcePtr,card_00);
      sourcePtr_local._7_1_ = false;
    }
  }
  return sourcePtr_local._7_1_;
}

Assistant:

bool stk_MoveCardFromTo(SolStack_t* sourcePtr, SolStack_t* targetPtr)
{
  if (sourcePtr && targetPtr) {
    Card_t card;
    if (stk_Pop(sourcePtr, &card)) {
      if (stk_PushCopy(targetPtr, card)) {
        stk_TurnTopCardUp(sourcePtr);
        return true;
      } else {
        // target stack is probably full, push the card back to source
        stk_PushCopy(sourcePtr, card);
        return false;
      }
    }
  }
  return false;
}